

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

bool __thiscall llvm::yaml::Scanner::scanValue(Scanner *this)

{
  int ToColumn;
  void *pvVar1;
  ilist_node_base<false> *piVar2;
  iterator pcVar3;
  ilist_node_base<false> *piVar4;
  ilist_node_base<false> *piVar5;
  ulong uVar6;
  iterator InsertPoint;
  ilist_node_base<false> *piVar7;
  list_type *plVar8;
  bool bVar9;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 local_40 [16];
  
  uVar6 = (ulong)(this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
                 super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
                 super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
                 super_SmallVectorBase.Size;
  if (uVar6 == 0) {
    if (this->FlowLevel == 0) {
      rollIndent(this,this->Column,TK_BlockMappingStart,(iterator)&(this->TokenQueue).List);
      bVar9 = this->FlowLevel == 0;
    }
    else {
      bVar9 = false;
    }
    this->IsSimpleKeyAllowed = bVar9;
  }
  else {
    if ((ulong)(this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
               super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
               super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
               super_SmallVectorBase.Capacity < uVar6 - 1) {
      __assert_fail("N <= capacity()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                    ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
    }
    pvVar1 = (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
             super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
             super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
             super_SmallVectorBase.BeginX;
    piVar2 = *(ilist_node_base<false> **)((long)pvVar1 + uVar6 * 0x18 + -0x18);
    ToColumn = *(int *)((long)pvVar1 + uVar6 * 0x18 + -0x10);
    (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
    super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
    super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.super_SmallVectorBase.
    Size = (uint)(uVar6 - 1);
    local_40[0] = 0;
    piVar4 = piVar2[1].Next;
    piVar5 = piVar2[2].Prev;
    piVar7 = &(this->TokenQueue).List.Sentinel.
              super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
              .super_node_base_type;
    plVar8 = &(this->TokenQueue).List;
    do {
      piVar7 = *(ilist_node_base<false> **)((long)piVar7 + 8);
      if (piVar7 == (ilist_node_base<false> *)plVar8) break;
    } while (piVar7 != piVar2);
    if (piVar7 == (ilist_node_base<false> *)plVar8) {
      this->Failed = true;
      return false;
    }
    InsertPoint.
    super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&>
    .I.NodePtr = (iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&>
                  )BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                             (&(this->TokenQueue).
                               super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>,
                              0x48,(Align)0x4);
    *(undefined8 *)
     InsertPoint.
     super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&>
     .I.NodePtr = 0;
    *(undefined8 *)
     ((long)InsertPoint.
            super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&>
            .I.NodePtr + 8) = 0;
    uStack_60 = SUB84(piVar4,0);
    uStack_5c = (undefined4)((ulong)piVar4 >> 0x20);
    *(undefined4 *)
     ((long)InsertPoint.
            super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&>
            .I.NodePtr + 0x10) = 0x10;
    *(undefined4 *)
     ((long)InsertPoint.
            super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&>
            .I.NodePtr + 0x14) = uStack_64;
    *(undefined4 *)
     ((long)InsertPoint.
            super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&>
            .I.NodePtr + 0x18) = uStack_60;
    *(undefined4 *)
     ((long)InsertPoint.
            super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&>
            .I.NodePtr + 0x1c) = uStack_5c;
    *(ilist_node_base<false> **)
     ((long)InsertPoint.
            super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&>
            .I.NodePtr + 0x20) = piVar5;
    *(long *)((long)InsertPoint.
                    super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&>
                    .I.NodePtr + 0x28) =
         (long)InsertPoint.
               super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&>
               .I.NodePtr + 0x38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)InsertPoint.
                      super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&>
                      .I.NodePtr + 0x28),local_40,local_40);
    piVar2 = piVar7->Prev;
    *(ilist_node_base<false> **)
     ((long)InsertPoint.
            super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&>
            .I.NodePtr + 8) = piVar7;
    *(ilist_node_base<false> **)
     InsertPoint.
     super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&>
     .I.NodePtr = piVar2;
    piVar2->Next = (ilist_node_base<false> *)
                   InsertPoint.
                   super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&>
                   .I.NodePtr;
    piVar7->Prev = (ilist_node_base<false> *)
                   InsertPoint.
                   super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&>
                   .I.NodePtr;
    rollIndent(this,ToColumn,TK_BlockMappingStart,InsertPoint);
    this->IsSimpleKeyAllowed = false;
  }
  local_40[0] = 0;
  pcVar3 = this->Current;
  skip(this,1);
  piVar7 = (ilist_node_base<false> *)
           BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                     (&(this->TokenQueue).
                       super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>,0x48,
                      (Align)0x4);
  piVar7->Prev = (ilist_node_base<false> *)0x0;
  piVar7->Next = (ilist_node_base<false> *)0x0;
  uStack_60 = SUB84(pcVar3,0);
  uStack_5c = (undefined4)((ulong)pcVar3 >> 0x20);
  *(undefined4 *)&piVar7[1].Prev = 0x11;
  *(undefined4 *)((long)&piVar7[1].Prev + 4) = uStack_64;
  *(undefined4 *)&piVar7[1].Next = uStack_60;
  *(undefined4 *)((long)&piVar7[1].Next + 4) = uStack_5c;
  piVar7[2].Prev = (ilist_node_base<false> *)0x1;
  piVar7[2].Next = (ilist_node_base<false> *)&piVar7[3].Next;
  std::__cxx11::string::_M_construct<char*>((string *)&piVar7[2].Next,local_40,local_40);
  plVar8 = &(this->TokenQueue).List;
  piVar2 = (plVar8->Sentinel).
           super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
           .super_node_base_type.Prev;
  piVar7->Next = (ilist_node_base<false> *)plVar8;
  piVar7->Prev = piVar2;
  piVar2->Next = piVar7;
  (plVar8->Sentinel).
  super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
  .super_node_base_type.Prev = piVar7;
  return true;
}

Assistant:

bool Scanner::scanValue() {
  // If the previous token could have been a simple key, insert the key token
  // into the token queue.
  if (!SimpleKeys.empty()) {
    SimpleKey SK = SimpleKeys.pop_back_val();
    Token T;
    T.Kind = Token::TK_Key;
    T.Range = SK.Tok->Range;
    TokenQueueT::iterator i, e;
    for (i = TokenQueue.begin(), e = TokenQueue.end(); i != e; ++i) {
      if (i == SK.Tok)
        break;
    }
    if (i == e) {
      Failed = true;
      return false;
    }
    i = TokenQueue.insert(i, T);

    // We may also need to add a Block-Mapping-Start token.
    rollIndent(SK.Column, Token::TK_BlockMappingStart, i);

    IsSimpleKeyAllowed = false;
  } else {
    if (!FlowLevel)
      rollIndent(Column, Token::TK_BlockMappingStart, TokenQueue.end());
    IsSimpleKeyAllowed = !FlowLevel;
  }

  Token T;
  T.Kind = Token::TK_Value;
  T.Range = StringRef(Current, 1);
  skip(1);
  TokenQueue.push_back(T);
  return true;
}